

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockingqueue.hpp
# Opt level: O3

Chunk * __thiscall
BlockingQueue<OrderedOutput::Chunk_*>::pop(BlockingQueue<OrderedOutput::Chunk_*> *this)

{
  Chunk *pCVar1;
  ulong uVar2;
  _Elt_pointer pIVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->mutex;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  pIVar3 = (this->items).c.
           super__Deque_base<BlockingQueue<OrderedOutput::Chunk_*>::Item,_std::allocator<BlockingQueue<OrderedOutput::Chunk_*>::Item>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->items).c.
      super__Deque_base<BlockingQueue<OrderedOutput::Chunk_*>::Item,_std::allocator<BlockingQueue<OrderedOutput::Chunk_*>::Item>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == pIVar3) {
    do {
      std::condition_variable::wait((unique_lock *)&this->itemsNotEmpty);
      pIVar3 = (this->items).c.
               super__Deque_base<BlockingQueue<OrderedOutput::Chunk_*>::Item,_std::allocator<BlockingQueue<OrderedOutput::Chunk_*>::Item>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->items).c.
             super__Deque_base<BlockingQueue<OrderedOutput::Chunk_*>::Item,_std::allocator<BlockingQueue<OrderedOutput::Chunk_*>::Item>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur == pIVar3);
  }
  pCVar1 = pIVar3->value;
  uVar2 = pIVar3->size;
  std::
  deque<BlockingQueue<OrderedOutput::Chunk_*>::Item,_std::allocator<BlockingQueue<OrderedOutput::Chunk_*>::Item>_>
  ::pop_front(&(this->items).c);
  if (uVar2 != 0) {
    if (this->totalSize < uVar2) {
      __assert_fail("totalSize >= item.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/src/blockingqueue.hpp"
                    ,0x2e,
                    "T BlockingQueue<OrderedOutput::Chunk *>::pop() [T = OrderedOutput::Chunk *]");
    }
    this->totalSize = this->totalSize - uVar2;
    std::unique_lock<std::mutex>::unlock(&local_28);
    std::condition_variable::notify_all();
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return pCVar1;
}

Assistant:

T pop()
	{
		std::unique_lock<std::mutex> lock(mutex);

		itemsNotEmpty.wait(lock, [&]() { return !items.empty(); });

		Item item = std::move(items.front());
		items.pop();

		if (item.size > 0)
		{
			assert(totalSize >= item.size);
			totalSize -= item.size;

			lock.unlock();
			itemsNotFull.notify_all();
		}

		return std::move(item.value);
	}